

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RandSequenceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandSequenceStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,Token *args_5,SyntaxList<slang::syntax::ProductionSyntax> *args_6,
          Token *args_7)

{
  size_t sVar1;
  pointer ppPVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxNode *pSVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  undefined4 uVar25;
  TokenKind TVar26;
  undefined1 uVar27;
  NumericTokenFlags NVar28;
  uint32_t uVar29;
  long lVar30;
  RandSequenceStatementSyntax *this_00;
  
  this_00 = (RandSequenceStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RandSequenceStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (RandSequenceStatementSyntax *)allocateSlow(this,0xe0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar9 = args_2->kind;
  uVar10 = args_2->field_0x2;
  NVar11.raw = (args_2->numFlags).raw;
  uVar12 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar17 = args_4->kind;
  uVar18 = args_4->field_0x2;
  NVar19.raw = (args_4->numFlags).raw;
  uVar20 = args_4->rawLen;
  pIVar5 = args_4->info;
  TVar21 = args_5->kind;
  uVar22 = args_5->field_0x2;
  NVar23.raw = (args_5->numFlags).raw;
  uVar24 = args_5->rawLen;
  pIVar6 = args_5->info;
  TVar26 = args_7->kind;
  uVar27 = args_7->field_0x2;
  NVar28.raw = (args_7->numFlags).raw;
  uVar29 = args_7->rawLen;
  pIVar7 = args_7->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,RandSequenceStatement,*args,args_1);
  (this_00->randsequence).kind = TVar9;
  (this_00->randsequence).field_0x2 = uVar10;
  (this_00->randsequence).numFlags = (NumericTokenFlags)NVar11.raw;
  (this_00->randsequence).rawLen = uVar12;
  (this_00->randsequence).info = pIVar3;
  (this_00->openParen).kind = TVar13;
  (this_00->openParen).field_0x2 = uVar14;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (this_00->openParen).rawLen = uVar16;
  (this_00->openParen).info = pIVar4;
  (this_00->firstProduction).kind = TVar17;
  (this_00->firstProduction).field_0x2 = uVar18;
  (this_00->firstProduction).numFlags = (NumericTokenFlags)NVar19.raw;
  (this_00->firstProduction).rawLen = uVar20;
  (this_00->firstProduction).info = pIVar5;
  (this_00->closeParen).kind = TVar21;
  (this_00->closeParen).field_0x2 = uVar22;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar23.raw;
  (this_00->closeParen).rawLen = uVar24;
  (this_00->closeParen).info = pIVar6;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_6->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar25 = *(undefined4 *)&(args_6->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar8 = (args_6->super_SyntaxListBase).super_SyntaxNode.parent;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_6->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this_00->productions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar25;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar8;
  (this_00->productions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (this_00->productions).super_SyntaxListBase.childCount = (args_6->super_SyntaxListBase).childCount
  ;
  sVar1 = (args_6->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this_00->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args_6->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this_00->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (this_00->productions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d6368;
  (this_00->endsequence).kind = TVar26;
  (this_00->endsequence).field_0x2 = uVar27;
  (this_00->endsequence).numFlags = (NumericTokenFlags)NVar28.raw;
  (this_00->endsequence).rawLen = uVar29;
  (this_00->endsequence).info = pIVar7;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this_00;
  sVar1 = (this_00->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppPVar2 = (this_00->productions).
              super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar30 = 0;
    do {
      *(RandSequenceStatementSyntax **)(*(long *)((long)ppPVar2 + lVar30) + 8) = this_00;
      lVar30 = lVar30 + 8;
    } while (sVar1 << 3 != lVar30);
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }